

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

void __thiscall
jsonnet::internal::Token::Token
          (Token *this,Kind kind,Fodder *fodder,string *data,string *string_block_indent,
          string *string_block_term_indent,LocationRange *location)

{
  string *in_RCX;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  string *in_R8;
  string *in_R9;
  LocationRange *this_00;
  LocationRange *this_01;
  undefined4 in_stack_fffffffffffffff0;
  
  *in_RDI = in_ESI;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RCX);
  this_01 = (LocationRange *)(in_RDI + 0x10);
  std::__cxx11::string::string((string *)this_01,in_R8);
  this_00 = (LocationRange *)(in_RDI + 0x18);
  std::__cxx11::string::string((string *)this_00,in_R9);
  LocationRange::LocationRange(this_01,this_00);
  return;
}

Assistant:

Token(Kind kind, const Fodder &fodder, const std::string &data,
          const std::string &string_block_indent, const std::string &string_block_term_indent,
          const LocationRange &location)
        : kind(kind),
          fodder(fodder),
          data(data),
          stringBlockIndent(string_block_indent),
          stringBlockTermIndent(string_block_term_indent),
          location(location)
    {
    }